

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_multiple.h
# Opt level: O0

bool __thiscall
density::detail::
LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
::Consume::advance_head(Consume *this)

{
  ControlBlock *pCVar1;
  bool bVar2;
  bool bVar3;
  undefined8 *puVar4;
  ControlBlock *pCVar5;
  bool is_same_page;
  ExternalBlock *external_block;
  ControlBlock *expected;
  ControlBlock *next;
  Consume *this_local;
  
  expected = (ControlBlock *)(this->m_next_ptr & 0xfffffffffffffff0);
  external_block = (ExternalBlock *)this->m_control;
  next = (ControlBlock *)this;
  bVar2 = std::atomic<density::detail::LfQueueControl_*>::compare_exchange_strong
                    (&this->m_queue->m_head,(__pointer_type *)&external_block,expected,
                     memory_order_seq_cst,memory_order_seq_cst);
  if (bVar2) {
    if ((this->m_next_ptr & 4) != 0) {
      puVar4 = (undefined8 *)address_add(this->m_control,0x18);
      basic_default_allocator<65536UL>::deallocate
                ((basic_default_allocator<65536UL> *)this->m_queue,(void *)*puVar4,puVar4[1],
                 puVar4[2],0);
    }
    bVar2 = LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
            ::same_page(this->m_control,expected);
    bVar3 = address_is_aligned(expected,0x10000);
    if (bVar2 == bVar3) {
      density_tests::detail::assert_failed<>
                ("is_same_page != address_is_aligned(next, ALLOCATOR_TYPE::page_alignment)",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_multiple.h"
                 ,0x163);
    }
    bVar3 = ConstConditional(true);
    if ((bVar3) &&
       (pCVar1 = this->m_control,
       pCVar5 = LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                ::get_end_control_block(this->m_control), bVar2 != (pCVar1 != pCVar5))) {
      density_tests::detail::assert_failed<>
                ("!ConstConditional(Base::s_needs_end_control) || is_same_page == (m_control != Base::get_end_control_block(m_control))"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_multiple.h"
                 ,0x166);
    }
    if (!bVar2) {
      raw_atomic_store(&this->m_control->m_next,0,memory_order_seq_cst);
      basic_default_allocator<65536UL>::deallocate_page
                ((basic_default_allocator<65536UL> *)this->m_queue,this->m_control);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool advance_head() const
                {
                    auto next = reinterpret_cast<ControlBlock *>(m_next_ptr & ~LfQueue_AllFlags);

                    auto expected = m_control;
                    if (m_queue->m_head.compare_exchange_strong(
                          expected, next, mem_seq_cst, mem_relaxed))
                    {
                        if (m_next_ptr & LfQueue_External)
                        {
                            auto const external_block = static_cast<ExternalBlock *>(
                              address_add(m_control, Base::s_element_min_offset));
                            m_queue->ALLOCATOR_TYPE::deallocate(
                              external_block->m_block,
                              external_block->m_size,
                              external_block->m_alignment);
                        }

                        bool const is_same_page = Base::same_page(m_control, next);
                        DENSITY_ASSERT_INTERNAL(
                          is_same_page != address_is_aligned(next, ALLOCATOR_TYPE::page_alignment));
                        DENSITY_ASSERT_INTERNAL(
                          !ConstConditional(Base::s_needs_end_control) ||
                          is_same_page == (m_control != Base::get_end_control_block(m_control)));

                        static_assert(offsetof(ControlBlock, m_next) == 0, "");

                        if (is_same_page)
                        {
                            if (Base::s_deallocate_zeroed_pages)
                            {
                                raw_atomic_store(&m_control->m_next, uintptr_t(0), mem_release);

                                auto const memset_dest =
                                  const_cast<uintptr_t *>(&m_control->m_next) + 1;
                                auto const memset_size = address_diff(next, memset_dest);
                                DENSITY_ASSUME_ALIGNED(memset_dest, alignof(uintptr_t));
                                DENSITY_ASSUME_UINT_ALIGNED(memset_size, alignof(uintptr_t));
                                std::memset(memset_dest, 0, memset_size);
                            }
                        }
                        else
                        {
                            /** the member m_next is zeroed even if s_deallocate_zeroed_pages is false, and before
                                deallocating the page, to allow a safe-pinning to the other consumers.
                                That is, if a consumers pins a page that is pointed by a m_next, and if after the pin
                                the m_next is still not zeroed, it can be sure that the allocator will not reuse the
                                page, even if it gets deallocated. If the consumer does not read again the member m_next
                                after pinning, it can't be sure that the page is recycled between the read of m_next and 
                                the pin. */
                            raw_atomic_store(&m_control->m_next, uintptr_t(0), mem_release);

                            if (Base::s_deallocate_zeroed_pages)
                                m_queue->ALLOCATOR_TYPE::deallocate_page_zeroed(m_control);
                            else
                                m_queue->ALLOCATOR_TYPE::deallocate_page(m_control);
                        }
                        return true;
                    }
                    else
                    {
                        return false;
                    }
                }